

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_io.hpp
# Opt level: O1

void __thiscall
coro_io::
callback_awaitor_base<async_simple::Try<std::pair<std::error_code,unsigned_long>>,coro_io::callback_awaitor<async_simple::Try<std::pair<std::error_code,unsigned_long>>>>
::awaitor_handler::set_value<async_simple::Try<std::pair<std::error_code,unsigned_long>>>
          (awaitor_handler *this,Try<int> *args)

{
  anon_class_8_1_8991fb9c local_8;
  
  local_8.this = (_Move_assign_base<false,_std::monostate,_std::pair<std::error_code,_unsigned_long>,_std::__exception_ptr::exception_ptr>
                  *)(*(long *)this + 8);
  (*std::__detail::__variant::
    __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:667:4)_&&,_std::variant<std::monostate,_std::pair<std::error_code,_unsigned_long>,_std::__exception_ptr::exception_ptr>_&>
    ::_S_vtable._M_arr
    [(long)(char)args[1]._value.
                 super__Variant_base<std::monostate,_int,_std::__exception_ptr::exception_ptr>.
                 super__Move_assign_alias<std::monostate,_int,_std::__exception_ptr::exception_ptr>.
                 super__Copy_assign_alias<std::monostate,_int,_std::__exception_ptr::exception_ptr>.
                 super__Move_ctor_alias<std::monostate,_int,_std::__exception_ptr::exception_ptr>.
                 super__Copy_ctor_alias<std::monostate,_int,_std::__exception_ptr::exception_ptr>.
                 super__Variant_storage_alias<std::monostate,_int,_std::__exception_ptr::exception_ptr>
                 ._M_index + 1]._M_data)(&local_8,&args->_value);
  return;
}

Assistant:

void set_value(Args &&...args) const {
      if constexpr (!std::is_void_v<Arg>) {
        obj->arg_ = {std::forward<Args>(args)...};
      }
    }